

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::UpdateBuffer
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,IBuffer *pBuffer,Uint64 Offset,
          Uint64 Size,void *pData,RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)

{
  IBuffer *Args;
  IBuffer *Args_6;
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  Uint64 extraout_RDX;
  Uint64 extraout_RDX_00;
  char *Args_2;
  undefined7 in_register_00000089;
  char (*Args_3) [8];
  char (*in_stack_ffffffffffffff88) [2];
  string msg;
  Uint64 Offset_local;
  String local_48;
  
  Args_3 = (char (*) [8])CONCAT71(in_register_00000089,StateTransitionMode);
  Args_2 = (char *)pData;
  Offset_local = Offset;
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&msg,(char (*) [79])
                      "Queue type may never be unknown for immediate contexts. This looks like a bug."
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"UpdateBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x6b8);
      Args_2 = (char *)pData;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        Args_2 = (char *)pData;
      }
    }
    FormatString<char[97]>
              (&msg,(char (*) [97])
                    "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UpdateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6b8);
    Offset = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      Offset = extraout_RDX_00;
    }
  }
  CVar2 = (this->m_Desc).QueueType;
  if ((CVar2 & COMMAND_QUEUE_TYPE_TRANSFER) == COMMAND_QUEUE_TYPE_UNKNOWN) {
    GetCommandQueueTypeString_abi_cxx11_
              (&local_48,(Diligent *)(ulong)CVar2,(COMMAND_QUEUE_TYPE)Offset);
    Args_2 = " queue.";
    FormatString<char[13],char[22],std::__cxx11::string,char[8]>
              (&msg,(Diligent *)0x81a1b0,(char (*) [13])0x917e3a,(char (*) [22])&local_48,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",Args_3
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UpdateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (pBuffer == (IBuffer *)0x0) {
    FormatString<char[24]>(&msg,(char (*) [24])0x919ca8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UpdateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6b9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_pActiveRenderPass).m_pObject != (RenderPassVkImpl *)0x0) {
    FormatString<char[58]>
              (&msg,(char (*) [58])"UpdateBuffer command must be used outside of render pass.");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UpdateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6ba);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (pBuffer != (IBuffer *)0x0) {
    CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>(pBuffer);
  }
  Args = pBuffer + 3;
  if ((*(byte *)((long)&pBuffer[5].super_IDeviceObject.super_IObject._vptr_IObject + 4) | 4) != 5) {
    FormatString<char[26],char_const*,char[79]>
              (&msg,(Diligent *)"Unable to update buffer \'",(char (*) [26])Args,
               (char **)
               "\': only USAGE_DEFAULT or USAGE_SPARSE buffers can be updated with UpdateData()",
               (char (*) [79])Args_2);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UpdateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6be);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  Args_6 = pBuffer + 4;
  if (pBuffer[4].super_IDeviceObject.super_IObject._vptr_IObject <= Offset_local) {
    FormatString<char[26],char_const*,char[12],unsigned_long,char[28],unsigned_long,char[2]>
              (&msg,(Diligent *)"Unable to update buffer \'",(char (*) [26])Args,
               (char **)"\': offset (",(char (*) [12])&Offset_local,
               (unsigned_long *)") exceeds the buffer size (",(char (*) [28])Args_6,
               (unsigned_long *)0x930f15,in_stack_ffffffffffffff88);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UpdateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6bf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  local_48._M_dataplus._M_p = (pointer)(Size + Offset_local);
  if ((Args_6->super_IDeviceObject).super_IObject._vptr_IObject < local_48._M_dataplus._M_p) {
    FormatString<char[26],char_const*,char[19],unsigned_long,char[2],unsigned_long,char[30],unsigned_long,char[2]>
              (&msg,(Diligent *)"Unable to update buffer \'",(char (*) [26])Args,
               (char **)"\': Update region [",(char (*) [19])&Offset_local,(unsigned_long *)0x864abb
               ,(char (*) [2])&local_48,(unsigned_long *)") is out of buffer bounds [0,",
               (char (*) [30])Args_6,(unsigned_long *)0x930f15,in_stack_ffffffffffffff88);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UpdateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  pUVar1 = &(this->m_Stats).CommandCounters.UpdateBuffer;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::UpdateBuffer(
    IBuffer*                       pBuffer,
    Uint64                         Offset,
    Uint64                         Size,
    const void*                    pData,
    RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_TRANSFER, "UpdateBuffer");
    DEV_CHECK_ERR(pBuffer != nullptr, "Buffer must not be null");
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "UpdateBuffer command must be used outside of render pass.");
#ifdef DILIGENT_DEVELOPMENT
    {
        const BufferDesc& BuffDesc = ClassPtrCast<BufferImplType>(pBuffer)->GetDesc();
        DEV_CHECK_ERR(BuffDesc.Usage == USAGE_DEFAULT || BuffDesc.Usage == USAGE_SPARSE, "Unable to update buffer '", BuffDesc.Name, "': only USAGE_DEFAULT or USAGE_SPARSE buffers can be updated with UpdateData()");
        DEV_CHECK_ERR(Offset < BuffDesc.Size, "Unable to update buffer '", BuffDesc.Name, "': offset (", Offset, ") exceeds the buffer size (", BuffDesc.Size, ")");
        DEV_CHECK_ERR(Size + Offset <= BuffDesc.Size, "Unable to update buffer '", BuffDesc.Name, "': Update region [", Offset, ",", Size + Offset, ") is out of buffer bounds [0,", BuffDesc.Size, ")");
    }
#endif

    ++m_Stats.CommandCounters.UpdateBuffer;
}